

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_anchor(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  ROOM_INDEX_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  short in_SI;
  __type_conflict2 _Var2;
  CHAR_DATA *oldanchor;
  CHAR_DATA *wch_next;
  CHAR_DATA *wch;
  CHAR_DATA *anchor;
  MOB_INDEX_DATA *in_stack_00000090;
  bool in_stack_0000009f;
  CHAR_DATA *in_stack_000000a0;
  CHAR_DATA *ch_00;
  CHAR_DATA *pCVar3;
  CHAR_DATA *arg1;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *pCVar4;
  CHAR_DATA *format;
  
  pCVar3 = (CHAR_DATA *)0x0;
  if ((in_RDX->in_room->sector_type != 7) && (in_RDX->in_room->sector_type != 8)) {
    ch_00 = (CHAR_DATA *)in_RDX->in_room->room_flags[0];
    _Var2 = std::pow<int,int>(0,0x6dbd9a);
    pCVar4 = char_list;
    if (((ulong)ch_00 & (long)_Var2) == 0) {
      do {
        arg1 = pCVar3;
        format = pCVar4;
        if (pCVar4 == (CHAR_DATA *)0x0) break;
        in_stack_ffffffffffffffc8 = pCVar4->next;
        arg1 = pCVar4;
        bVar1 = is_npc(ch_00);
        pCVar4 = in_stack_ffffffffffffffc8;
      } while (((!bVar1) || (arg1->pIndexData->vnum != 0xb8e)) ||
              (format = arg1, arg1->hunting != in_RDX));
      if (arg1 != (CHAR_DATA *)0x0) {
        act((char *)format,in_stack_ffffffffffffffc8,arg1,ch_00,0);
        extract_char(in_stack_000000a0,in_stack_0000009f);
      }
      get_mob_index((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      pCVar3 = create_mobile(in_stack_00000090);
      char_to_room(in_RDX,in_RCX);
      pCVar3->level = in_SI;
      pCVar3->hunting = in_RDX;
      act((char *)format,in_stack_ffffffffffffffc8,arg1,ch_00,0);
      act((char *)format,in_stack_ffffffffffffffc8,arg1,ch_00,0);
      return;
    }
  }
  send_to_char(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void spell_anchor(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *anchor, *wch, *wch_next, *oldanchor = nullptr;

	if (ch->in_room->sector_type == SECT_INSIDE
		|| ch->in_room->sector_type == SECT_UNDERWATER
		|| IS_SET(ch->in_room->room_flags, ROOM_NO_RECALL))
	{
		send_to_char("You cannot create an anchor here.\n\r", ch);
		return;
	}

	for (wch = char_list; wch != nullptr; wch = wch_next)
	{
		wch_next = wch->next;

		if (is_npc(wch) && wch->pIndexData->vnum == MOB_VNUM_ANCHOR && wch->hunting == ch)
		{
			oldanchor = wch;
			break;
		}
	}

	if (oldanchor)
	{
		act("$n dissipates harmlessly.", oldanchor, 0, 0, TO_ROOM);
		extract_char(oldanchor, true);
	}

	anchor = create_mobile(get_mob_index(MOB_VNUM_ANCHOR));
	char_to_room(anchor, ch->in_room);
	anchor->level = level;
	anchor->hunting = ch;

	act("You harness the energy in the surrounding air to anchor your essence to this spot.", ch, 0, 0, TO_CHAR);
	act("$n concentrates intently, and a small funnel cloud begins to spin in place beside $m.", ch, 0, 0, TO_ROOM);
}